

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

bool MeCab::Viterbi::initPartial(Lattice *lattice)

{
  long lVar1;
  _func_int **__dest;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar5;
  size_type sVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *pcVar7;
  undefined4 extraout_var_06;
  char *pcVar8;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **ppcVar9;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  size_type __n;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  _func_int **pp_Var14;
  _func_int **pp_Var15;
  long lVar16;
  size_type sVar17;
  bool bVar18;
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> tokens;
  vector<char_*,_std::allocator<char_*>_> lines;
  StringBuffer os;
  char *column [2];
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> local_b8;
  pair<char_*,_char_*> local_98;
  void *local_88;
  iterator iStack_80;
  char **local_78;
  StringBuffer local_70;
  char *local_48 [3];
  
  iVar3 = (*lattice->_vptr_Lattice[0x12])(lattice,4);
  if ((char)iVar3 == '\0') {
    iVar3 = (*lattice->_vptr_Lattice[0x1e])(lattice);
    if ((char)iVar3 != '\0') {
      (*lattice->_vptr_Lattice[0x21])(lattice,0,1);
      iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
      (*lattice->_vptr_Lattice[0x21])(lattice,CONCAT44(extraout_var_04,iVar3),1);
    }
  }
  else {
    iVar3 = (*lattice->_vptr_Lattice[0x16])();
    iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)(CONCAT44(extraout_var,iVar3) + 0x50),
               CONCAT44(extraout_var_00,iVar4) + 1);
    __dest = *(_func_int ***)(CONCAT44(extraout_var,iVar3) + 0x50);
    iVar3 = (*lattice->_vptr_Lattice[8])(lattice);
    iVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    strncpy((char *)__dest,(char *)CONCAT44(extraout_var_01,iVar3),
            CONCAT44(extraout_var_02,iVar4) + 1);
    local_88 = (void *)0x0;
    iStack_80._M_current = (char **)0x0;
    local_78 = (char **)0x0;
    iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
    local_70._vptr_StringBuffer = __dest;
    sVar5 = strlen((char *)__dest);
    sVar6 = CONCAT44(extraout_var_03,iVar3) + 1;
    if (sVar6 == 0) {
      __n = 0;
    }
    else {
      pp_Var14 = (_func_int **)(sVar5 + (long)__dest);
      sVar17 = 0;
      do {
        for (; (pp_Var15 = pp_Var14, __dest != pp_Var14 &&
               (pp_Var15 = __dest, *(char *)__dest != '\n'));
            __dest = (_func_int **)((long)__dest + 1)) {
        }
        *(char *)pp_Var15 = '\0';
        if (iStack_80._M_current == local_78) {
          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                    ((vector<char*,std::allocator<char*>> *)&local_88,iStack_80,(char **)&local_70);
        }
        else {
          *iStack_80._M_current = (char *)local_70._vptr_StringBuffer;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        __n = sVar17 + 1;
      } while ((pp_Var15 != pp_Var14) &&
              (local_70._vptr_StringBuffer = (_func_int **)((long)pp_Var15 + 1),
              bVar18 = sVar17 != CONCAT44(extraout_var_03,iVar3), __n = sVar6,
              __dest = local_70._vptr_StringBuffer, sVar17 = sVar17 + 1, bVar18));
    }
    iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
    pcVar7 = (char *)operator_new__(CONCAT44(extraout_var_05,iVar3) + 1);
    iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
    local_70.alloc_size_ = CONCAT44(extraout_var_06,iVar3) + 1;
    local_70._vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0019c358;
    sVar5 = 0;
    local_70.size_ = 0;
    local_70.is_delete_ = false;
    local_70.error_ = false;
    local_b8.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<char_*,_char_*> *)0x0;
    local_b8.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pair<char_*,_char_*> *)0x0;
    local_b8.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<char_*,_char_*> *)0x0;
    local_70.ptr_ = pcVar7;
    std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::reserve
              (&local_b8,__n);
    ppcVar9 = extraout_RDX;
    if (__n != 0) {
      sVar6 = 0;
      do {
        pcVar11 = *(char **)((long)local_88 + sVar6 * 8);
        sVar5 = strlen(pcVar11);
        pcVar8 = pcVar11 + sVar5;
        sVar5 = 0;
        pcVar2 = pcVar8;
        pcVar12 = pcVar11;
        ppcVar9 = local_48;
        do {
          while( true ) {
            if (pcVar11 == pcVar8) {
              *pcVar8 = '\0';
              *ppcVar9 = pcVar2;
              pcVar11 = local_48[0];
              if (sVar5 == 0) {
                iVar3 = strcmp(local_48[0],"EOS");
                ppcVar9 = extraout_RDX_01;
                if (iVar3 == 0) goto LAB_00152f32;
                local_98.first = pcVar11;
                local_98.second = (char *)0x0;
                if (local_b8.
                    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_b8.
                    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00152efa;
                std::vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>>::
                _M_realloc_insert<std::pair<char*,char*>>
                          ((vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>> *)
                           &local_b8,
                           (iterator)
                           local_b8.
                           super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_98);
                ppcVar9 = extraout_RDX_03;
                goto LAB_00152f08;
              }
              goto LAB_00152e8e;
            }
            if (*pcVar11 == '\t') break;
            pcVar11 = pcVar11 + 1;
            pcVar2 = pcVar12;
          }
          *pcVar11 = '\0';
          *ppcVar9 = pcVar12;
          ppcVar9 = ppcVar9 + 1;
          sVar5 = sVar5 + 1;
          pcVar11 = pcVar11 + 1;
          pcVar2 = pcVar8;
          pcVar12 = pcVar11;
        } while (sVar5 != 2);
LAB_00152e8e:
        pcVar11 = local_48[0];
        local_98.first = local_48[0];
        local_98.second = local_48[1];
        if (local_b8.
            super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_b8.
            super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>>::
          _M_realloc_insert<std::pair<char*,char*>>
                    ((vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>> *)
                     &local_b8,
                     (iterator)
                     local_b8.
                     super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_98);
          ppcVar9 = extraout_RDX_00;
        }
        else {
LAB_00152efa:
          (local_b8.
           super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = pcVar11;
          (local_b8.
           super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_98.second;
          local_b8.
          super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_b8.
               super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          local_98.first = pcVar11;
        }
LAB_00152f08:
        StringBuffer::write(&local_70,(int)pcVar11,ppcVar9,sVar5);
        sVar6 = sVar6 + 1;
        ppcVar9 = extraout_RDX_02;
      } while (sVar6 != __n);
    }
LAB_00152f32:
    StringBuffer::write(&local_70,0,ppcVar9,sVar5);
    pcVar11 = local_70.ptr_;
    if (local_70.error_ != false) {
      pcVar11 = (char *)0x0;
    }
    (*lattice->_vptr_Lattice[9])(lattice,pcVar11);
    if (local_b8.
        super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_b8.
        super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      lVar16 = 0;
      do {
        pcVar11 = local_b8.
                  super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].second;
        sVar5 = strlen(local_b8.
                       super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].first);
        (*lattice->_vptr_Lattice[0x21])(lattice,lVar16,1);
        lVar1 = sVar5 + lVar16;
        (*lattice->_vptr_Lattice[0x21])(lattice,lVar1,1);
        if ((pcVar11 != (char *)0x0) &&
           ((*lattice->_vptr_Lattice[0x22])(lattice,lVar16,lVar1,pcVar11), 1 < sVar5)) {
          lVar13 = sVar5 - 1;
          do {
            lVar16 = lVar16 + 1;
            (*lattice->_vptr_Lattice[0x21])(lattice,lVar16,2);
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        uVar10 = uVar10 + 1;
        lVar16 = lVar1;
      } while (uVar10 < (ulong)((long)local_b8.
                                      super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_b8.
                                      super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    if (local_b8.
        super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pair<char_*,_char_*> *)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    StringBuffer::~StringBuffer(&local_70);
    operator_delete__(pcVar7);
    if (local_88 != (void *)0x0) {
      operator_delete(local_88);
    }
  }
  return true;
}

Assistant:

bool Viterbi::initPartial(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_PARTIAL)) {
    if (lattice->has_constraint()) {
      lattice->set_boundary_constraint(0, MECAB_TOKEN_BOUNDARY);
      lattice->set_boundary_constraint(lattice->size(),
                                       MECAB_TOKEN_BOUNDARY);
    }
    return true;
  }

  Allocator<Node, Path> *allocator = lattice->allocator();
  char *str = allocator->partial_buffer(lattice->size() + 1);
  strncpy(str, lattice->sentence(), lattice->size() + 1);

  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                lattice->size() + 1);
  char* column[2];
  scoped_array<char> buf(new char[lattice->size() + 1]);
  StringBuffer os(buf.get(), lattice->size() + 1);

  std::vector<std::pair<char *, char *> > tokens;
  tokens.reserve(lsize);

  size_t pos = 0;
  for (size_t i = 0; i < lsize; ++i) {
    const size_t size = tokenize(lines[i], "\t", column, 2);
    if (size == 1 && std::strcmp(column[0], "EOS") == 0) {
      break;
    }
    const size_t len = std::strlen(column[0]);
    if (size == 2) {
      tokens.push_back(std::make_pair(column[0], column[1]));
    } else {
      tokens.push_back(std::make_pair(column[0], reinterpret_cast<char *>(0)));
    }
    os << column[0];
    pos += len;
  }

  os << '\0';

  lattice->set_sentence(os.str());

  pos = 0;
  for (size_t i = 0; i < tokens.size(); ++i) {
    const char *surface = tokens[i].first;
    const char *feature = tokens[i].second;
    const size_t len = std::strlen(surface);
    lattice->set_boundary_constraint(pos, MECAB_TOKEN_BOUNDARY);
    lattice->set_boundary_constraint(pos + len, MECAB_TOKEN_BOUNDARY);
    if (feature) {
      lattice->set_feature_constraint(pos, pos + len, feature);
      for (size_t n = 1; n < len; ++n) {
        lattice->set_boundary_constraint(pos + n,
                                         MECAB_INSIDE_TOKEN);
      }
    }
    pos += len;
  }

  return true;
}